

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

bool __thiscall FileSystemUtils::Path::CreateDir(Path *this)

{
  bool bVar1;
  int iVar2;
  Path parentpath;
  Path PStack_38;
  
  if (((this->m_string)._M_string_length != 0) && (bVar1 = Exists(this), !bVar1)) {
    ParentPath(&PStack_38,this);
    bVar1 = Exists(&PStack_38);
    if (!bVar1) {
      CreateDir(&PStack_38);
    }
    iVar2 = mkdir((this->m_string)._M_dataplus._M_p,0x1ff);
    ~Path(&PStack_38);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

inline bool Path::CreateDir() const
	{
        if( m_string.length() == 0 )
        {
            return false;
        }
        if( Exists() )
        {
            return false;
        }

        // we may need to create the parent path recursively
        Path parentpath = ParentPath();
        if( !parentpath.Exists() )
        {
            parentpath.CreateDir();
        }

		int error = -1;
#ifdef _WIN32
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wmkdir( temp.c_str() );
#else
		error = mkdir( m_string.c_str(), 0777 );
#endif
		if( 0 == error )
		{
			return true;
		}
		return false;
	}